

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForInObjectEnumerator.cpp
# Opt level: O0

BOOL __thiscall
Js::ForInObjectEnumerator::InitializeCurrentEnumerator
          (ForInObjectEnumerator *this,RecyclableObject *object,EnumeratorCache *forInCache)

{
  EnumeratorCache *object_00;
  EnumeratorFlags EVar1;
  TypeId TVar2;
  BOOL BVar3;
  RecyclableObject *this_00;
  ScriptContext *scriptContext;
  RecyclableObject *prototype;
  EnumeratorCache *pEStack_20;
  EnumeratorFlags flags;
  EnumeratorCache *forInCache_local;
  RecyclableObject *object_local;
  ForInObjectEnumerator *this_local;
  
  pEStack_20 = forInCache;
  forInCache_local = (EnumeratorCache *)object;
  object_local = (RecyclableObject *)this;
  prototype._7_1_ = JavascriptStaticEnumerator::GetFlags(&this->enumerator);
  this_00 = RecyclableObject::GetPrototype((RecyclableObject *)forInCache_local);
  if (this_00 != (RecyclableObject *)0x0) {
    TVar2 = RecyclableObject::GetTypeId(this_00);
    if (TVar2 != TypeIds_Null) goto LAB_0108718c;
  }
  EVar1 = operator~(EnumNonEnumerable);
  operator&=((EnumeratorFlags *)((long)&prototype + 7),EVar1);
LAB_0108718c:
  object_00 = forInCache_local;
  EVar1 = prototype._7_1_;
  scriptContext = GetScriptContext(this);
  BVar3 = InitializeCurrentEnumerator
                    (this,(RecyclableObject *)object_00,EVar1,scriptContext,pEStack_20);
  return BVar3;
}

Assistant:

BOOL ForInObjectEnumerator::InitializeCurrentEnumerator(RecyclableObject * object, EnumeratorCache * forInCache)
    {
        EnumeratorFlags flags = enumerator.GetFlags();
        RecyclableObject * prototype = object->GetPrototype();
        if (prototype == nullptr || prototype->GetTypeId() == TypeIds_Null)
        {
            // If this is the last object on the prototype chain, we don't need to get the non-enumerable properties any more to track shadowing
            flags &= ~EnumeratorFlags::EnumNonEnumerable;
        }
        return InitializeCurrentEnumerator(object, flags, GetScriptContext(), forInCache);
    }